

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::LogTickIterator::AdjustRange(LogTickIterator *this,float *ioMin,float *ioMax)

{
  AxisSetup *pAVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  
  pAVar1 = (this->super_TickIterator).mAxisSetup;
  fVar6 = pAVar1->mLogBase;
  lVar2 = pAVar1->mMaxDecades;
  if (0 < lVar2) {
    fVar3 = (float)lVar2;
    fVar5 = *ioMax;
    fVar4 = 1e+10;
    if (fVar3 <= 1e+10) {
      fVar4 = fVar3;
    }
    fVar4 = powf(fVar6,fVar4);
    *ioMin = fVar5 / fVar4;
  }
  if ((((*ioMin == 0.0) && (!NAN(*ioMin))) && (*ioMax == 0.0)) && (!NAN(*ioMax))) {
    *ioMin = 1e-10;
    *ioMax = 1.0;
  }
  bVar7 = 0.0 < *ioMax && 0.0 < *ioMin;
  if (bVar7) {
    fVar5 = RoundDown(this,*ioMin * 1.0001);
    *ioMin = fVar5;
    fVar5 = RoundUp(this,*ioMax * 0.9999);
    *ioMax = fVar5;
    if (*ioMin <= 1e-10 && *ioMin != 1e-10) {
      *ioMin = 1e-10;
    }
    lVar2 = ((this->super_TickIterator).mAxisSetup)->mMaxDecades;
    if (0 < lVar2) {
      fVar3 = (float)lVar2;
      fVar5 = *ioMax;
      fVar4 = 1e+10;
      if (fVar3 <= 1e+10) {
        fVar4 = fVar3;
      }
      fVar6 = powf(fVar6,fVar4);
      *ioMin = fVar5 / fVar6;
    }
  }
  return bVar7;
}

Assistant:

bool LogTickIterator::AdjustRange (float &ioMin, float &ioMax) const {

      float theBase = mAxisSetup->mLogBase;
      long theLogFac = 1;//mAxisSetup->mLogFactor;
      if (mAxisSetup->mMaxDecades > 0) {
        ioMin = ioMax/SafeExp (mAxisSetup->mMaxDecades, theBase, theLogFac);
      }
      if (ioMin == 0 && ioMax == 0) {
          ioMin = kLogMinClipValue;
          ioMax = 1.0f;
      }
      if (ioMin <= 0 || ioMax<=0) {
        return false;
      }
      ioMin = RoundDown (ioMin*kLittleIncrease);
      ioMax = RoundUp (ioMax*kLittleDecrease);

      if (ioMin<kLogMinClipValue) {
        ioMin = kLogMinClipValue;
      }
      if (mAxisSetup->mMaxDecades > 0) {
        ioMin = ioMax/SafeExp (mAxisSetup->mMaxDecades, theBase, theLogFac);
      }
      return true;
    }